

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

MessageLite *
google::protobuf::internal::TcParser::AddMessage
          (TcParseTableBase *table,RepeatedPtrFieldBase *field)

{
  Arena *arena;
  bool bVar1;
  int __old_val;
  int iVar2;
  void **ppvVar3;
  MessageLite *pMVar4;
  Rep *pRVar5;
  int iVar6;
  anon_class_8_1_a8aa2aee local_20;
  
  pMVar4 = (MessageLite *)field->tagged_rep_or_elem_;
  arena = field->arena_;
  local_20.table = table;
  if (pMVar4 == (MessageLite *)0x0) {
    field->current_size_ = 1;
    pMVar4 = AddMessage::anon_class_8_1_a8aa2aee::operator()(&local_20,arena);
    field->tagged_rep_or_elem_ = pMVar4;
  }
  else if (((ulong)pMVar4 & 1) == 0) {
    if (field->current_size_ == 0) {
      field->current_size_ = 1;
    }
    else {
      ppvVar3 = RepeatedPtrFieldBase::InternalExtend(field,1);
      pMVar4 = AddMessage::anon_class_8_1_a8aa2aee::operator()(&local_20,arena);
      *ppvVar3 = pMVar4;
      pRVar5 = RepeatedPtrFieldBase::rep(field);
      pRVar5->allocated_size = 2;
      field->current_size_ = 2;
      pMVar4 = (MessageLite *)*ppvVar3;
    }
  }
  else {
    pRVar5 = RepeatedPtrFieldBase::rep(field);
    bVar1 = RepeatedPtrFieldBase::SizeAtCapacity(field);
    if (bVar1) {
      RepeatedPtrFieldBase::InternalExtend(field,1);
      pRVar5 = RepeatedPtrFieldBase::rep(field);
      iVar2 = field->current_size_;
      iVar6 = pRVar5->allocated_size;
    }
    else {
      iVar2 = field->current_size_;
      iVar6 = iVar2;
      if (iVar2 != pRVar5->allocated_size) {
        field->current_size_ = iVar2 + 1;
        return (MessageLite *)pRVar5->elements[iVar2];
      }
    }
    pRVar5->allocated_size = iVar6 + 1;
    field->current_size_ = iVar2 + 1;
    pMVar4 = AddMessage::anon_class_8_1_a8aa2aee::operator()(&local_20,arena);
    pRVar5->elements[iVar2] = pMVar4;
  }
  return pMVar4;
}

Assistant:

MessageLite* TcParser::AddMessage(const TcParseTableBase* table,
                                  RepeatedPtrFieldBase& field) {
  return static_cast<MessageLite*>(field.AddInternal(
      [table](Arena* arena) { return NewMessage(table, arena); }));
}